

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O1

file_info * heap_get_entry(heap_queue *heap)

{
  uint uVar1;
  file_info **ppfVar2;
  file_info *pfVar3;
  ulong uVar4;
  file_info *pfVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  iVar10 = heap->used;
  if (iVar10 < 1) {
    return (file_info *)0x0;
  }
  ppfVar2 = heap->files;
  pfVar3 = *ppfVar2;
  uVar1 = iVar10 - 1;
  heap->used = uVar1;
  *ppfVar2 = ppfVar2[uVar1];
  if (2 < iVar10) {
    uVar4 = (*heap->files)->key;
    iVar10 = 0;
    iVar9 = 1;
    iVar7 = 0;
    do {
      ppfVar2 = heap->files;
      uVar6 = ppfVar2[iVar9]->key;
      iVar10 = iVar10 + 2;
      iVar8 = iVar9;
      if ((iVar10 < (int)uVar1) && (ppfVar2[iVar10]->key < uVar6)) {
        uVar6 = ppfVar2[iVar10]->key;
        iVar8 = iVar10;
      }
      if (uVar4 <= uVar6) {
        return pfVar3;
      }
      pfVar5 = ppfVar2[iVar7];
      ppfVar2[iVar7] = ppfVar2[iVar8];
      heap->files[iVar8] = pfVar5;
      iVar9 = iVar8 * 2 + 1;
      iVar10 = iVar8 * 2;
      iVar7 = iVar8;
    } while (iVar9 < (int)uVar1);
  }
  return pfVar3;
}

Assistant:

static struct file_info *
heap_get_entry(struct heap_queue *heap)
{
	uint64_t a_key, b_key, c_key;
	int a, b, c;
	struct file_info *r, *tmp;

	if (heap->used < 1)
		return (NULL);

	/*
	 * The first file in the list is the earliest; we'll return this.
	 */
	r = heap->files[0];

	/*
	 * Move the last item in the heap to the root of the tree
	 */
	heap->files[0] = heap->files[--(heap->used)];

	/*
	 * Rebalance the heap.
	 */
	a = 0; /* Starting element and its heap key */
	a_key = heap->files[a]->key;
	for (;;) {
		b = a + a + 1; /* First child */
		if (b >= heap->used)
			return (r);
		b_key = heap->files[b]->key;
		c = b + 1; /* Use second child if it is smaller. */
		if (c < heap->used) {
			c_key = heap->files[c]->key;
			if (c_key < b_key) {
				b = c;
				b_key = c_key;
			}
		}
		if (a_key <= b_key)
			return (r);
		tmp = heap->files[a];
		heap->files[a] = heap->files[b];
		heap->files[b] = tmp;
		a = b;
	}
}